

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.h
# Opt level: O0

void __thiscall CSemaphore::post(CSemaphore *this)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffd8,(mutex_type *)0x32de43);
  *(int *)(in_RDI + 0x58) = *(int *)(in_RDI + 0x58) + 1;
  std::lock_guard<std::mutex>::~lock_guard(in_stack_ffffffffffffffd8);
  std::condition_variable::notify_one();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void post() noexcept
    {
        {
            std::lock_guard<std::mutex> lock(mutex);
            value++;
        }
        condition.notify_one();
    }